

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerGLSL::emit_constant(CompilerGLSL *this,SPIRConstant *constant)

{
  string *ts_1;
  ID id;
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  mapped_type *name_00;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  uint32_t local_8c;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  string local_70;
  string name;
  
  pSVar3 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(constant->super_IVariant).field_0xc);
  wg_x.id.id = 0;
  wg_y.id.id = 0;
  wg_z.id.id = 0;
  uVar2 = Compiler::get_work_group_size_specialization_constants
                    (&this->super_Compiler,&wg_x,&wg_y,&wg_z);
  id.id = (constant->super_IVariant).self.id;
  if (id.id == uVar2) {
    return;
  }
  bVar4 = true;
  if ((id.id != wg_x.id.id) && (id.id != wg_y.id.id)) {
    bVar4 = id.id == wg_z.id.id;
  }
  bVar1 = (this->options).vulkan_semantics;
  if ((bVar4 & bVar1) != 0) {
    return;
  }
  if ((bVar4 == true && bVar1 == false) &&
     (bVar1 = Compiler::has_decoration(&this->super_Compiler,id,DecorationSpecId), !bVar1)) {
    return;
  }
  name._M_dataplus._M_p._0_4_ = (constant->super_IVariant).self.id;
  name_00 = ::std::__detail::
            _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&(this->super_Compiler).ir.meta,(key_type *)&name);
  add_variable(this,&this->resource_names,&this->block_names,(string *)name_00);
  (*(this->super_Compiler)._vptr_Compiler[6])(&name,this,(ulong)(constant->super_IVariant).self.id);
  bVar1 = Compiler::has_decoration
                    (&this->super_Compiler,(ID)(constant->super_IVariant).self.id,DecorationSpecId);
  if (bVar1) {
    if ((this->options).vulkan_semantics == true) {
      local_8c = Compiler::get_decoration
                           (&this->super_Compiler,(ID)(constant->super_IVariant).self.id,
                            DecorationSpecId);
      (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_b0,this,pSVar3);
      constant_expression_abi_cxx11_(&local_70,this,constant,false,false);
      statement<char_const(&)[22],unsigned_int,char_const(&)[9],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (this,(char (*) [22])"layout(constant_id = ",&local_8c,(char (*) [9])0x371a73,
                 &local_b0,(char (*) [4])0x37d8ee,&local_70,(char (*) [2])0x365574);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_001e6225;
    }
    else {
      ts_1 = &constant->specialization_constant_macro_name;
      statement<char_const(&)[9],std::__cxx11::string_const&>(this,(char (*) [9])"#ifndef ",ts_1);
      constant_expression_abi_cxx11_(&local_b0,this,constant,false,false);
      statement<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string>
                (this,(char (*) [9])"#define ",ts_1,(char (*) [2])0x366d9b,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
      if (bVar4 != false) goto LAB_001e6225;
      (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_b0,this,pSVar3,&name,0);
      statement<char_const(&)[7],std::__cxx11::string,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[2]>
                (this,(char (*) [7])0x371a75,&local_b0,(char (*) [4])0x37d8ee,ts_1,
                 (char (*) [2])0x365574);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_001e6225;
    }
  }
  else {
    (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_b0,this,pSVar3);
    constant_expression_abi_cxx11_(&local_70,this,constant,false,false);
    statement<char_const(&)[7],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (this,(char (*) [7])0x371a75,&local_b0,(char (*) [4])0x37d8ee,&local_70,
               (char (*) [2])0x365574);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_001e6225;
  }
  operator_delete(local_b0._M_dataplus._M_p);
LAB_001e6225:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(name._M_dataplus._M_p._4_4_,(uint32_t)name._M_dataplus._M_p) != &name.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(name._M_dataplus._M_p._4_4_,(uint32_t)name._M_dataplus._M_p));
  }
  return;
}

Assistant:

void CompilerGLSL::emit_constant(const SPIRConstant &constant)
{
	auto &type = get<SPIRType>(constant.constant_type);

	SpecializationConstant wg_x, wg_y, wg_z;
	ID workgroup_size_id = get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

	// This specialization constant is implicitly declared by emitting layout() in;
	if (constant.self == workgroup_size_id)
		return;

	// These specialization constants are implicitly declared by emitting layout() in;
	// In legacy GLSL, we will still need to emit macros for these, so a layout() in; declaration
	// later can use macro overrides for work group size.
	bool is_workgroup_size_constant = ConstantID(constant.self) == wg_x.id || ConstantID(constant.self) == wg_y.id ||
	                                  ConstantID(constant.self) == wg_z.id;

	if (options.vulkan_semantics && is_workgroup_size_constant)
	{
		// Vulkan GLSL does not need to declare workgroup spec constants explicitly, it is handled in layout().
		return;
	}
	else if (!options.vulkan_semantics && is_workgroup_size_constant &&
	         !has_decoration(constant.self, DecorationSpecId))
	{
		// Only bother declaring a workgroup size if it is actually a specialization constant, because we need macros.
		return;
	}

	add_resource_name(constant.self);
	auto name = to_name(constant.self);

	// Only scalars have constant IDs.
	if (has_decoration(constant.self, DecorationSpecId))
	{
		if (options.vulkan_semantics)
		{
			statement("layout(constant_id = ", get_decoration(constant.self, DecorationSpecId), ") const ",
			          variable_decl(type, name), " = ", constant_expression(constant), ";");
		}
		else
		{
			const string &macro_name = constant.specialization_constant_macro_name;
			statement("#ifndef ", macro_name);
			statement("#define ", macro_name, " ", constant_expression(constant));
			statement("#endif");

			// For workgroup size constants, only emit the macros.
			if (!is_workgroup_size_constant)
				statement("const ", variable_decl(type, name), " = ", macro_name, ";");
		}
	}
	else
	{
		statement("const ", variable_decl(type, name), " = ", constant_expression(constant), ";");
	}
}